

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

int lj_tab_isarray(GCtab *src)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  
  pdVar5 = (double *)((src->node).ptr64 + (ulong)src->hmask * 0x18 + 8);
  lVar3 = (ulong)src->hmask + 1;
  do {
    if (pdVar5[-1] != -NAN) {
      if (0xfff8 < *(ushort *)((long)pdVar5 + 6)) {
        return 0;
      }
      dVar1 = *pdVar5;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar1;
      auVar6 = roundsd(ZEXT816(0),auVar6,4);
      if (auVar6._0_8_ != dVar1) {
        return 0;
      }
      if (NAN(auVar6._0_8_) || NAN(dVar1)) {
        return 0;
      }
    }
    pdVar5 = pdVar5 + -3;
    lVar4 = lVar3 + -1;
    bVar2 = lVar3 < 1;
    lVar3 = lVar4;
    if (lVar4 == 0 || bVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

int LJ_FASTCALL lj_tab_isarray(const GCtab *src)
{
  Node *node;
  cTValue *o;
  ptrdiff_t i;

  node = noderef(src->node);
  for (i = (ptrdiff_t)src->hmask; i >= 0; i--)
    if (!tvisnil(&node[i].val)) {
      o = &node[i].key;
      if (LJ_UNLIKELY(tvisint(o))) {
        continue;
      }
      if (LJ_UNLIKELY(tvisnum(o))) {
        lua_Number n = numberVnum(o);
        if (LJ_LIKELY(rint((double) n) == n)) {
          continue;
        }
      }
      return 0;
    }

  return 1;
}